

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_stack.c
# Opt level: O3

void push_control_stack(control_stack *s,control_frame val)

{
  ulong uVar1;
  uint64 uVar2;
  undefined7 uVar3;
  control_frame *pcVar4;
  long lVar5;
  control_frame *pcVar6;
  byte bVar7;
  
  bVar7 = 0;
  uVar1 = s->cap;
  uVar2 = s->size;
  if (uVar1 < uVar2 + 1) {
    s->cap = uVar1 + 0x10;
    pcVar6 = s->bp;
    pcVar4 = (control_frame *)malloc((uVar1 * 8 + 0x80) * 9);
    s->bp = pcVar4;
    memcpy(pcVar4,pcVar6,uVar2 * 0x48);
    s->sp = pcVar4 + uVar2;
    free(pcVar6);
  }
  pcVar6 = &val;
  pcVar4 = s->sp;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar3 = *(undefined7 *)&pcVar6->field_0x1;
    pcVar4->opcode = pcVar6->opcode;
    *(undefined7 *)&pcVar4->field_0x1 = uVar3;
    pcVar6 = (control_frame *)((long)pcVar6 + (ulong)bVar7 * -0x10 + 8);
    pcVar4 = (control_frame *)((long)pcVar4 + (ulong)bVar7 * -0x10 + 8);
  }
  s->sp = s->sp + 1;
  s->size = s->size + 1;
  return;
}

Assistant:

void push_control_stack(control_stack *s, control_frame val) {
    if ((get_control_stack_size(s) + 1) > s->cap) {
        s->cap += CONTROL_STACK_INIT_SIZE;
        void *old_bp = s->bp;
        s->bp = malloc(s->cap * CONTROL_STACK_ELE_SIZE);
        memcpy(s->bp, old_bp, get_control_stack_size(s) * CONTROL_STACK_ELE_SIZE);
        s->sp = s->bp + get_control_stack_size(s);
        free(old_bp);
    }
    *(s->sp) = val;
    s->sp += 1;
    s->size++;
}